

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

uint llvm::dwarf::TagVendor(Tag Tag)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  
  uVar1 = 0;
  if (CONCAT22(in_register_0000003a,Tag) < 0x4200) {
    uVar1 = 0;
    switch(CONCAT22(in_register_0000003a,Tag)) {
    case 0x4101:
    case 0x4102:
    case 0x4103:
    case 0x4106:
    case 0x4107:
    case 0x4108:
    case 0x4109:
    case 0x410a:
      uVar1 = 3;
      break;
    case 0x4104:
    case 0x4105:
      break;
    default:
      uVar1 = 0;
      if (CONCAT22(in_register_0000003a,Tag) == 0x4081) {
        uVar1 = 6;
      }
    }
  }
  else {
    switch(CONCAT22(in_register_0000003a,Tag)) {
    case 0xb000:
    case 0xb001:
    case 0xb002:
    case 0xb003:
    case 0xb004:
      uVar1 = 2;
      break;
    default:
      if (CONCAT22(in_register_0000003a,Tag) == 0x4200) {
        uVar1 = 1;
      }
    }
  }
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::TagVendor(dwarf::Tag Tag) {
  switch (Tag) {
  default:
    return 0;
#define HANDLE_DW_TAG(ID, NAME, VERSION, VENDOR, KIND)                         \
  case DW_TAG_##NAME:                                                          \
    return DWARF_VENDOR_##VENDOR;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}